

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_init_v2(void *ctx,EncImplCfg *cfg)

{
  long lVar1;
  long lVar2;
  MppEncJpegCfg *jpeg_cfg;
  MppEncRcCfg *rc;
  JpegeCtx *p;
  EncImplCfg *cfg_local;
  void *ctx_local;
  
  mpp_env_get_u32("jpege_debug",&jpege_debug,0);
  if ((jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_init_v2",ctx);
  }
  *(MppEncCfgSet **)ctx = cfg->cfg;
  cfg->coding = MPP_VIDEO_CodingMJPEG;
  lVar1 = *ctx;
  lVar2 = *ctx;
  *(undefined4 *)(lVar1 + 0xa8) = 0;
  *(undefined4 *)(lVar1 + 0xac) = 0x1e;
  *(undefined4 *)(lVar1 + 0xb0) = 1;
  *(undefined4 *)(lVar1 + 0xb4) = 0;
  *(undefined4 *)(lVar1 + 0xb8) = 0x1e;
  *(undefined4 *)(lVar1 + 0xbc) = 1;
  *(undefined4 *)(lVar1 + 0x94) = 0;
  *(undefined4 *)(lVar2 + 0x34c) = 10;
  if ((jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_init_v2",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_init_v2(void *ctx, EncImplCfg *cfg)
{
    JpegeCtx *p = (JpegeCtx *)ctx;

    mpp_env_get_u32("jpege_debug", &jpege_debug, 0);
    jpege_dbg_func("enter ctx %p\n", ctx);

    p->cfg = cfg->cfg;

    mpp_assert(cfg->coding = MPP_VIDEO_CodingMJPEG);

    {
        /* init default rc config */
        MppEncRcCfg *rc = &p->cfg->rc;
        MppEncJpegCfg *jpeg_cfg = &p->cfg->codec.jpeg;

        rc->fps_in_flex = 0;
        rc->fps_in_num = 30;
        rc->fps_in_denom = 1;
        rc->fps_out_flex = 0;
        rc->fps_out_num = 30;
        rc->fps_out_denom = 1;
        rc->rc_mode = MPP_ENC_RC_MODE_VBR;
        /* init default quant */
        jpeg_cfg->quant = 10;
    }

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}